

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar2 = (byte *)s;
LAB_00110976:
  do {
    if (((anonymous_namespace)::chartype_table[*pbVar2] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar2[1]] & 1) != 0) {
        pbVar2 = pbVar2 + 1;
        goto LAB_001109c8;
      }
      if (((anonymous_namespace)::chartype_table[pbVar2[2]] & 1) != 0) {
        pbVar2 = pbVar2 + 2;
        goto LAB_001109c8;
      }
      bVar4 = ((anonymous_namespace)::chartype_table[pbVar2[3]] & 1) == 0;
      if (bVar4) {
        pbVar2 = pbVar2 + 4;
      }
      else {
        pbVar2 = pbVar2 + 3;
      }
    }
    else {
LAB_001109c8:
      bVar4 = false;
    }
  } while (bVar4);
  pbVar1 = pbVar2;
  if (*pbVar2 == 0x3c) goto LAB_001109ee;
  if (*pbVar2 != 0) {
    pbVar2 = pbVar2 + 1;
    goto LAB_00110976;
  }
  do {
    pbVar3 = pbVar1;
    if (pbVar3 <= s) break;
    pbVar1 = pbVar3 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar3[-1]] & 8) != 0);
  *pbVar3 = 0;
  return (char_t *)pbVar2;
  while (pbVar1 = pbVar3 + -1, ((anonymous_namespace)::chartype_table[pbVar3[-1]] & 8) != 0) {
LAB_001109ee:
    pbVar3 = pbVar1;
    if (pbVar3 <= s) break;
  }
  *pbVar3 = 0;
  return (char_t *)(pbVar2 + 1);
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}